

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_allEqual_uvec4(ShaderEvalContext *c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int i;
  long lVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Vector<unsigned_int,_4> res_1;
  Vector<unsigned_int,_4> res;
  
  fVar3 = c->in[0].m_data[0];
  fVar4 = c->in[0].m_data[1];
  fVar5 = c->in[0].m_data[2];
  fVar6 = c->in[0].m_data[3];
  iVar9 = (int)fVar3;
  iVar11 = (int)fVar4;
  iVar13 = (int)fVar5;
  iVar15 = (int)fVar6;
  auVar17._0_4_ = iVar9 >> 0x1f;
  auVar17._4_4_ = iVar11 >> 0x1f;
  auVar17._8_4_ = iVar13 >> 0x1f;
  auVar17._12_4_ = iVar15 >> 0x1f;
  auVar1._4_4_ = (int)(fVar4 - 2.1474836e+09);
  auVar1._0_4_ = (int)(fVar3 - 2.1474836e+09);
  auVar1._8_4_ = (int)(fVar5 - 2.1474836e+09);
  auVar1._12_4_ = (int)(fVar6 - 2.1474836e+09);
  auVar18._4_4_ = iVar11;
  auVar18._0_4_ = iVar9;
  auVar18._8_4_ = iVar13;
  auVar18._12_4_ = iVar15;
  auVar18 = auVar17 & auVar1 | auVar18;
  auVar2 = auVar18._4_12_;
  res.m_data[0] = auVar2._0_4_;
  res.m_data[1] = auVar2._4_4_;
  res.m_data[2] = auVar2._8_4_;
  res.m_data[3] = auVar18._0_4_;
  fVar3 = c->in[1].m_data[0];
  fVar4 = c->in[1].m_data[1];
  fVar5 = c->in[1].m_data[2];
  fVar6 = c->in[1].m_data[3];
  uVar10 = (uint)fVar3;
  uVar12 = (uint)fVar4;
  uVar14 = (uint)fVar5;
  uVar16 = (uint)fVar6;
  res_1.m_data[0] = (int)uVar16 >> 0x1f & (int)(fVar6 - 2.1474836e+09) | uVar16;
  res_1.m_data[1] = (int)uVar14 >> 0x1f & (int)(fVar5 - 2.1474836e+09) | uVar14;
  res_1.m_data[2] = (int)uVar12 >> 0x1f & (int)(fVar4 - 2.1474836e+09) | uVar12;
  res_1.m_data[3] = (int)uVar10 >> 0x1f & (int)(fVar3 - 2.1474836e+09) | uVar10;
  bVar8 = true;
  lVar7 = 0;
  do {
    if (bVar8) {
      bVar8 = res.m_data[lVar7] == res_1.m_data[lVar7];
    }
    else {
      bVar8 = false;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  (c->color).m_data[0] = (float)bVar8;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }